

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O2

void __thiscall Assimp::XFileParser::ParseDataObjectTemplate(XFileParser *this)

{
  bool bVar1;
  string name;
  string s;
  string guid;
  allocator local_a1;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  readHeadOfDataObject(this,&local_a0);
  GetNextToken_abi_cxx11_(&local_40,this);
  while( true ) {
    GetNextToken_abi_cxx11_(&local_60,this);
    bVar1 = std::operator==(&local_60,"}");
    if ((!bVar1) && (local_60._M_string_length == 0)) break;
    std::__cxx11::string::~string((string *)&local_60);
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_a0);
      return;
    }
  }
  std::__cxx11::string::string
            ((string *)&local_80,"Unexpected end of file reached while parsing template definition",
             &local_a1);
  ThrowException(this,&local_80);
}

Assistant:

void XFileParser::ParseDataObjectTemplate()
{
    // parse a template data object. Currently not stored.
    std::string name;
    readHeadOfDataObject( &name);

    // read GUID
    std::string guid = GetNextToken();

    // read and ignore data members
    bool running = true;
    while ( running )
    {
        std::string s = GetNextToken();

        if( s == "}")
            break;

        if( s.length() == 0)
            ThrowException( "Unexpected end of file reached while parsing template definition");
    }
}